

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_approach.cpp
# Opt level: O3

line_bound * find_longest_line(line_bound *__return_storage_ptr__,Mat *img)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  
  __return_storage_ptr__->ibegin = 0;
  __return_storage_ptr__->iend = 0;
  __return_storage_ptr__->size = 0;
  sVar1 = (size_t)*(int *)(img + 0xc);
  if (sVar1 != 0) {
    sVar2 = 0;
    uVar3 = 0;
    sVar4 = 0;
    sVar5 = 0;
    uVar7 = 0;
    sVar6 = 0;
    do {
      if (*(char *)(*(long *)(img + 0x10) + sVar4) == '\0') {
        if (uVar3 < uVar7) {
          sVar2 = sVar4;
          uVar3 = uVar7;
          sVar6 = sVar5;
        }
        uVar7 = 0;
        sVar5 = 0;
      }
      else {
        bVar8 = uVar7 == 0;
        uVar7 = uVar7 + 1;
        if (bVar8) {
          sVar5 = sVar4;
        }
      }
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
    __return_storage_ptr__->size = uVar3;
    __return_storage_ptr__->iend = sVar2;
    __return_storage_ptr__->ibegin = sVar6;
    if (uVar3 < uVar7) {
      __return_storage_ptr__->size = uVar7;
      __return_storage_ptr__->ibegin = sVar5;
      __return_storage_ptr__->iend = sVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

line_bound find_longest_line(const cv::Mat& img)
{
    line_bound result {0, 0, 0};
    std::size_t max = 0;

    std::size_t ibegin = 0;
    std::size_t current = 0;

    const uint8_t* arr = img.ptr<uint8_t>(0, 0);
    std::size_t iend = img.cols;
    for(std::size_t i = 0; i < iend; i++)
    {
        if(arr[i] > 0)
        {
            if(current == 0)
            {
                ibegin = i;
                current++;
            }
            else
            {
                current++;
            }
        }
        else
        {
            if(current > result.size)
            {
                result.size = current;
                result.ibegin = ibegin;
                result.iend = i;
            }
            current = 0;
            ibegin = 0;
        }
    }
    if(current > result.size)
    {
        result.size = current;
        result.ibegin = ibegin;
        result.iend = iend;
    }

    return result;
}